

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

ogg_int64_t ov_pcm_total(OggVorbis_File *vf,int i)

{
  ogg_int64_t oVar1;
  ogg_int64_t oVar2;
  int i_00;
  int iVar3;
  
  oVar2 = -0x83;
  if (((1 < vf->ready_state) && (vf->seekable != 0)) && (iVar3 = vf->links, i < iVar3)) {
    if (i < 0) {
      oVar2 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (i_00 = 0; iVar3 != i_00; i_00 = i_00 + 1) {
        oVar1 = ov_pcm_total(vf,i_00);
        oVar2 = oVar2 + oVar1;
      }
    }
    else {
      oVar2 = vf->pcmlengths[(ulong)(uint)(i * 2) + 1];
    }
  }
  return oVar2;
}

Assistant:

ogg_int64_t ov_pcm_total(OggVorbis_File *vf,int i){
  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable || i>=vf->links)return(OV_EINVAL);
  if(i<0){
    ogg_int64_t acc=0;
    int i;
    for(i=0;i<vf->links;i++)
      acc+=ov_pcm_total(vf,i);
    return(acc);
  }else{
    return(vf->pcmlengths[i*2+1]);
  }
}